

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

double __thiscall
HighsMipSolverData::computeNewUpperLimit
          (HighsMipSolverData *this,double ub,double mip_abs_gap,double mip_rel_gap)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = (this->objectiveFunction).objIntScale;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    dVar1 = floor(dVar3 * ub + -0.5);
    dVar1 = dVar1 / dVar3;
    if ((mip_rel_gap != 0.0) || (dVar2 = dVar1, NAN(mip_rel_gap))) {
      dVar2 = ceil(ABS(this->mipsolver->model_->offset_ + ub) * mip_rel_gap * dVar3 -
                   ((this->mipsolver->mipdata_)._M_t.
                    super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                    .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->epsilon);
      dVar2 = ub - dVar2 / dVar3;
      if (dVar1 <= dVar2) {
        dVar2 = dVar1;
      }
    }
    if ((mip_abs_gap != 0.0) || (dVar1 = dVar2, NAN(mip_abs_gap))) {
      dVar1 = ceil(mip_abs_gap * dVar3 -
                   ((this->mipsolver->mipdata_)._M_t.
                    super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                    .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->epsilon);
      dVar1 = ub - dVar1 / dVar3;
      if (dVar2 <= dVar1) {
        dVar1 = dVar2;
      }
    }
    dVar3 = dVar1 + this->feastol;
  }
  else {
    dVar1 = ub - this->feastol;
    dVar3 = nextafter(ub,-INFINITY);
    if (dVar1 <= dVar3) {
      dVar3 = dVar1;
    }
    if (((mip_rel_gap != 0.0) || (dVar1 = dVar3, NAN(mip_rel_gap))) &&
       (dVar1 = ub - mip_rel_gap * ABS(this->mipsolver->model_->offset_ + ub), dVar3 <= dVar1)) {
      dVar1 = dVar3;
    }
    if (((mip_abs_gap != 0.0) || (dVar3 = dVar1, NAN(mip_abs_gap))) &&
       (dVar3 = ub - mip_abs_gap, dVar1 <= ub - mip_abs_gap)) {
      dVar3 = dVar1;
    }
  }
  return dVar3;
}

Assistant:

double HighsMipSolverData::computeNewUpperLimit(double ub, double mip_abs_gap,
                                                double mip_rel_gap) const {
  double new_upper_limit;
  if (objectiveFunction.isIntegral()) {
    new_upper_limit =
        (std::floor(objectiveFunction.integralScale() * ub - 0.5) /
         objectiveFunction.integralScale());

    if (mip_rel_gap != 0.0)
      new_upper_limit = std::min(
          new_upper_limit,
          ub - std::ceil(mip_rel_gap * fabs(ub + mipsolver.model_->offset_) *
                             objectiveFunction.integralScale() -
                         mipsolver.mipdata_->epsilon) /
                   objectiveFunction.integralScale());

    if (mip_abs_gap != 0.0)
      new_upper_limit = std::min(
          new_upper_limit,
          ub - std::ceil(mip_abs_gap * objectiveFunction.integralScale() -
                         mipsolver.mipdata_->epsilon) /
                   objectiveFunction.integralScale());

    // add feasibility tolerance so that the next best integer feasible solution
    // is definitely included in the remaining search
    new_upper_limit += feastol;
  } else {
    new_upper_limit = std::min(ub - feastol, std::nextafter(ub, -kHighsInf));

    if (mip_rel_gap != 0.0)
      new_upper_limit =
          std::min(new_upper_limit,
                   ub - mip_rel_gap * fabs(ub + mipsolver.model_->offset_));

    if (mip_abs_gap != 0.0)
      new_upper_limit = std::min(new_upper_limit, ub - mip_abs_gap);
  }

  return new_upper_limit;
}